

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddExecutableCommand.cxx
# Opt level: O3

bool __thiscall
cmAddExecutableCommand::InitialPass
          (cmAddExecutableCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  TargetType TVar7;
  undefined8 uVar8;
  cmTarget *pcVar9;
  long lVar10;
  ostream *poVar11;
  pointer pbVar12;
  pointer pbVar13;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  string msg;
  undefined1 local_1e8 [36];
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  undefined1 local_1b8 [112];
  ios_base local_148 [264];
  pointer local_40;
  cmCommand *local_38;
  
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar13 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar12 == pbVar13) {
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1b8);
  }
  else {
    __first._M_current = pbVar12 + 1;
    if (__first._M_current == pbVar13) {
      bVar4 = false;
      local_1c4 = 0;
      bVar2 = false;
      bVar5 = false;
      local_1c0 = 0;
      local_1bc = 0;
      pbVar13 = pbVar12;
    }
    else {
      local_1bc = 0;
      local_1c0 = 0;
      bVar5 = false;
      bVar2 = false;
      local_1c4 = 0;
      bVar4 = false;
      pbVar13 = pbVar12;
      local_40 = pbVar12;
      local_38 = &this->super_cmCommand;
      do {
        pbVar12 = pbVar13;
        __first._M_current = pbVar12 + 1;
        uVar8 = std::__cxx11::string::compare((char *)__first._M_current);
        if ((int)uVar8 == 0) {
          local_1bc = (uint)CONCAT71((int7)((ulong)uVar8 >> 8),1);
        }
        else {
          uVar8 = std::__cxx11::string::compare((char *)__first._M_current);
          if ((int)uVar8 == 0) {
            local_1c0 = (uint)CONCAT71((int7)((ulong)uVar8 >> 8),1);
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)__first._M_current);
            if (iVar6 == 0) {
              bVar5 = true;
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)__first._M_current);
              if (iVar6 == 0) {
                bVar4 = true;
              }
              else if ((bVar4) &&
                      (uVar8 = std::__cxx11::string::compare((char *)__first._M_current),
                      (int)uVar8 == 0)) {
                local_1c4 = (uint)CONCAT71((int7)((ulong)uVar8 >> 8),1);
              }
              else {
                iVar6 = std::__cxx11::string::compare((char *)__first._M_current);
                this = (cmAddExecutableCommand *)local_38;
                pbVar13 = local_40;
                if (iVar6 != 0) goto LAB_0017ceae;
                bVar2 = true;
              }
            }
          }
        }
        pbVar13 = pbVar12 + 1;
      } while (pbVar12 + 2 !=
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
      __first._M_current = pbVar12 + 2;
      pbVar12 = pbVar12 + 1;
      this = (cmAddExecutableCommand *)local_38;
      pbVar13 = local_40;
    }
LAB_0017ceae:
    bVar3 = cmGeneratorExpression::IsValidTargetName(pbVar13);
    if ((!bVar3) || (bVar3 = cmGlobalGenerator::IsReservedTarget(pbVar13), bVar3)) {
LAB_0017ceca:
      bVar3 = cmMakefile::CheckCMP0037((this->super_cmCommand).Makefile,pbVar13,EXECUTABLE);
      if (!bVar3) {
        return false;
      }
      if (bVar4) {
LAB_0017d027:
        if ((local_1bc & 1) == 0) {
          if ((local_1c0 & 1) == 0) {
            if (bVar5 == false) {
              if (!bVar2) {
                pcVar9 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,pbVar13,false)
                ;
                if (pcVar9 == (cmTarget *)0x0) {
                  cmMakefile::AddImportedTarget
                            ((this->super_cmCommand).Makefile,pbVar13,EXECUTABLE,
                             (bool)((byte)local_1c4 & 1));
                  return true;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b8,"cannot create imported target \"",0x1f);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1b8,(pbVar13->_M_dataplus)._M_p,
                                     pbVar13->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" because another target with the same name already exists.",
                           0x3b);
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(&this->super_cmCommand,(string *)local_1e8);
LAB_0017d389:
                if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
                  operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
                std::ios_base::~ios_base(local_148);
                return false;
              }
              bVar5 = cmGeneratorExpression::IsValidTargetName(pbVar13);
              if (bVar5) goto LAB_0017d244;
              goto LAB_0017d29f;
            }
            local_1b8._0_8_ = local_1b8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,
                       "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.","");
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1b8);
          }
          else {
            local_1b8._0_8_ = local_1b8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,"may not be given MACOSX_BUNDLE for an IMPORTED target.",
                       "");
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1b8);
          }
        }
        else {
          local_1b8._0_8_ = local_1b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b8,"may not be given WIN32 for an IMPORTED target.","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1b8);
        }
      }
      else {
        if (bVar2) goto LAB_0017d0aa;
LAB_0017cef8:
        pcVar1 = local_1b8 + 0x10;
        local_1b8._8_8_ = 0;
        local_1b8[0x10] = '\0';
        local_1b8._0_8_ = pcVar1;
        bVar4 = cmMakefile::EnforceUniqueName
                          ((this->super_cmCommand).Makefile,pbVar13,(string *)local_1b8,false);
        if (bVar4) {
          if ((pointer)local_1b8._0_8_ != pcVar1) {
            operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_1e8,
                     __first,(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)local_1b8
                    );
          pcVar9 = cmMakefile::AddExecutable
                             ((this->super_cmCommand).Makefile,pbVar13,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1e8,bVar5);
          if ((local_1bc & 1) != 0) {
            local_1b8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,"WIN32_EXECUTABLE","");
            cmTarget::SetProperty(pcVar9,(string *)local_1b8,"ON");
            if ((pointer)local_1b8._0_8_ != pcVar1) {
              operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1
                             );
            }
          }
          if ((local_1c0 & 1) != 0) {
            local_1b8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"MACOSX_BUNDLE","");
            cmTarget::SetProperty(pcVar9,(string *)local_1b8,"ON");
            if ((pointer)local_1b8._0_8_ != pcVar1) {
              operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1
                             );
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1e8);
          return true;
        }
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1b8);
      }
    }
    else {
      if (bVar4) goto LAB_0017d027;
      if (!bVar2) {
        lVar10 = std::__cxx11::string::find((char)pbVar13,0x3a);
        if (lVar10 != -1) goto LAB_0017ceca;
        goto LAB_0017cef8;
      }
LAB_0017d0aa:
      bVar4 = cmGeneratorExpression::IsValidTargetName(pbVar13);
      if (!bVar4) {
LAB_0017d29f:
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8,"Invalid name for ALIAS: ",pbVar13);
        cmCommand::SetError(&this->super_cmCommand,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1b8);
        if ((undefined1 *)local_1b8._0_8_ == local_1b8 + 0x10) {
          return false;
        }
        goto LAB_0017d27c;
      }
      if (bVar5) {
        local_1b8._0_8_ = local_1b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,"EXCLUDE_FROM_ALL with ALIAS makes no sense.","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1b8);
        goto LAB_0017d272;
      }
      if ((local_1c4 & 1) == 0) {
        if ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start == 0x60) {
          bVar5 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,__first._M_current);
          if (bVar5) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,"cannot create ALIAS target \"",0x1c);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b8,(pbVar13->_M_dataplus)._M_p,
                                 pbVar13->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" because target \"",0x12);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,((__first._M_current)->_M_dataplus)._M_p,
                                 pbVar12[1]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,"\" is itself an ALIAS.",0x15);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1e8);
          }
          else {
            pcVar9 = cmMakefile::FindTargetToUse
                               ((this->super_cmCommand).Makefile,__first._M_current,true);
            if (pcVar9 == (cmTarget *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b8,"cannot create ALIAS target \"",0x1c);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b8,(pbVar13->_M_dataplus)._M_p,
                                   pbVar13->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,"\" because target \"",0x12);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,((__first._M_current)->_M_dataplus)._M_p,
                                   pbVar12[1]._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,"\" does not already exist.",0x19);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,(string *)local_1e8);
            }
            else {
              TVar7 = cmTarget::GetType(pcVar9);
              if (TVar7 == EXECUTABLE) {
                bVar5 = cmTarget::IsImported(pcVar9);
                if ((!bVar5) || (bVar5 = cmTarget::IsImportedGloballyVisible(pcVar9), bVar5)) {
                  cmMakefile::AddAlias((this->super_cmCommand).Makefile,pbVar13,__first._M_current);
                  return true;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b8,"cannot create ALIAS target \"",0x1c);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1b8,(pbVar13->_M_dataplus)._M_p,
                                     pbVar13->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" because target \"",0x12);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,((__first._M_current)->_M_dataplus)._M_p,
                                     pbVar12[1]._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" is imported but not globally visible.",0x27);
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(&this->super_cmCommand,(string *)local_1e8);
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b8,"cannot create ALIAS target \"",0x1c);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1b8,(pbVar13->_M_dataplus)._M_p,
                                     pbVar13->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" because target \"",0x12);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,((__first._M_current)->_M_dataplus)._M_p,
                                     pbVar12[1]._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" is not an executable.",0x17);
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(&this->super_cmCommand,(string *)local_1e8);
              }
            }
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,"ALIAS requires exactly one target argument.",0x2b);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1e8);
        }
        goto LAB_0017d389;
      }
LAB_0017d244:
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"IMPORTED with ALIAS is not allowed.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_1b8);
    }
  }
LAB_0017d272:
  if ((undefined1 *)local_1b8._0_8_ == local_1b8 + 0x10) {
    return false;
  }
LAB_0017d27c:
  operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1);
  return false;
}

Assistant:

bool cmAddExecutableCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::string>::const_iterator s = args.begin();

  std::string const& exename = *s;

  ++s;
  bool use_win32 = false;
  bool use_macbundle = false;
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;
  bool isAlias = false;
  while (s != args.end()) {
    if (*s == "WIN32") {
      ++s;
      use_win32 = true;
    } else if (*s == "MACOSX_BUNDLE") {
      ++s;
      use_macbundle = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (*s == "ALIAS") {
      ++s;
      isAlias = true;
    } else {
      break;
    }
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(exename) &&
    !cmGlobalGenerator::IsReservedTarget(exename);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = exename.find(':') == std::string::npos;
  }
  if (!nameOk &&
      !this->Makefile->CheckCMP0037(exename, cmStateEnums::EXECUTABLE)) {
    return false;
  }

  // Special modifiers are not allowed with IMPORTED signature.
  if (importTarget && (use_win32 || use_macbundle || excludeFromAll)) {
    if (use_win32) {
      this->SetError("may not be given WIN32 for an IMPORTED target.");
    } else if (use_macbundle) {
      this->SetError("may not be given MACOSX_BUNDLE for an IMPORTED target.");
    } else // if(excludeFromAll)
    {
      this->SetError(
        "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.");
    }
    return false;
  }
  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(exename)) {
      this->SetError("Invalid name for ALIAS: " + exename);
      return false;
    }
    if (excludeFromAll) {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
    }

    std::string const& aliasedName = *s;
    if (this->Makefile->IsAlias(aliasedName)) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
    }
    cmTarget* aliasedTarget =
      this->Makefile->FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" does not already exist.";
      this->SetError(e.str());
      return false;
    }
    cmStateEnums::TargetType type = aliasedTarget->GetType();
    if (type != cmStateEnums::EXECUTABLE) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is not an executable.";
      this->SetError(e.str());
      return false;
    }
    if (aliasedTarget->IsImported() &&
        !aliasedTarget->IsImportedGloballyVisible()) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is imported but not globally visible.";
      this->SetError(e.str());
      return false;
    }
    this->Makefile->AddAlias(exename, aliasedName);
    return true;
  }

  // Handle imported target creation.
  if (importTarget) {
    // Make sure the target does not already exist.
    if (this->Makefile->FindTargetToUse(exename)) {
      std::ostringstream e;
      e << "cannot create imported target \"" << exename
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
    }

    // Create the imported target.
    this->Makefile->AddImportedTarget(exename, cmStateEnums::EXECUTABLE,
                                      importGlobal);
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!this->Makefile->EnforceUniqueName(exename, msg)) {
      this->SetError(msg);
      return false;
    }
  }

  std::vector<std::string> srclists(s, args.end());
  cmTarget* tgt =
    this->Makefile->AddExecutable(exename, srclists, excludeFromAll);
  if (use_win32) {
    tgt->SetProperty("WIN32_EXECUTABLE", "ON");
  }
  if (use_macbundle) {
    tgt->SetProperty("MACOSX_BUNDLE", "ON");
  }

  return true;
}